

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool HasCDATA(Lexer *lexer,Node *node)

{
  ctmbstr ptVar1;
  int len;
  ctmbstr start;
  Node *node_local;
  Lexer *lexer_local;
  
  if (node->type == TextNode) {
    ptVar1 = prvTidytmbsubstrn(lexer->lexbuf + node->start,(node->end - node->start) + 1,CDATA_START
                              );
    lexer_local._4_4_ = (Bool)(ptVar1 != (ctmbstr)0x0);
  }
  else {
    lexer_local._4_4_ = no;
  }
  return lexer_local._4_4_;
}

Assistant:

static Bool HasCDATA( Lexer* lexer, Node* node )
{
    /* Scan forward through the textarray. Since the characters we're
    ** looking for are < 0x7f, we don't have to do any UTF-8 decoding.
    */
    ctmbstr start = lexer->lexbuf + node->start;
    int len = node->end - node->start + 1;

    if ( node->type != TextNode )
        return no;

    return ( NULL != TY_(tmbsubstrn)( start, len, CDATA_START ));
}